

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.h
# Opt level: O1

bool mocker::detail::runOptPassImpl<mocker::RemoveUnreachableBlocks>
               (Module *module,FuncPass *param_2)

{
  bool bVar1;
  bool bVar2;
  _Hash_node_base *p_Var3;
  RemoveUnreachableBlocks local_30;
  
  p_Var3 = (module->funcs)._M_h._M_before_begin._M_nxt;
  bVar2 = false;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      if (*(char *)&p_Var3[0x11]._M_nxt == '\0') {
        RemoveUnreachableBlocks::RemoveUnreachableBlocks(&local_30,(FunctionModule *)(p_Var3 + 5));
        bVar1 = RemoveUnreachableBlocks::operator()(&local_30);
        bVar2 = (bool)(bVar2 | bVar1);
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return bVar2;
}

Assistant:

bool runOptPassImpl(ir::Module &module, FuncPass *, Args &&... args) {
  auto res = false;
  for (auto &func : module.getFuncs()) {
    if (func.second.isExternalFunc())
      continue;
    res |= Pass{func.second, std::forward<Args>(args)...}();
  }
  return res;
}